

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_model_ex(rf_model model,rf_vec3 position,rf_vec3 rotation_axis,float rotationAngle,
                     rf_vec3 scale,rf_color tint)

{
  rf_color rVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  rf_mat left;
  undefined1 auVar10 [56];
  rf_mat left_00;
  rf_mat right;
  rf_mat right_00;
  rf_mat right_01;
  rf_mesh mesh;
  rf_material material;
  long lVar11;
  undefined8 unaff_RBX;
  rf_mesh *prVar12;
  undefined8 unaff_RBP;
  long lVar13;
  rf_mesh *prVar14;
  rf_material *prVar15;
  undefined8 *puVar16;
  undefined8 unaff_R12;
  undefined8 unaff_R13;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  byte bVar17;
  int iVar18;
  int iVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  short sVar22;
  int iVar23;
  rf_color rVar25;
  int iVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 unaff_retaddr;
  rf_mat result_1;
  rf_mat mat_scale;
  rf_mat mat_transform;
  rf_mat mat_rotation;
  undefined8 local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  uint *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar24;
  undefined6 uVar26;
  
  bVar17 = 0;
  rf_mat_rotate((rf_mat *)&stack0xffffffffffffff90,rotation_axis,rotationAngle * 0.017453292);
  local_1d8._4_4_ = position.y;
  auVar10 = ZEXT4456(CONCAT440(scale.z,ZEXT2440(CONCAT816((ulong)(uint)scale.y << 0x20,
                                                          ZEXT416((uint)scale.x)))));
  left.m11 = 0.0;
  left.m15 = 1.0;
  left.m0 = (float)auVar10._0_4_;
  left.m4 = (float)auVar10._4_4_;
  left.m8 = (float)auVar10._8_4_;
  left.m12 = (float)auVar10._12_4_;
  left.m1 = (float)auVar10._16_4_;
  left.m5 = (float)auVar10._20_4_;
  left.m9 = (float)auVar10._24_4_;
  left.m13 = (float)auVar10._28_4_;
  left.m2 = (float)auVar10._32_4_;
  left.m6 = (float)auVar10._36_4_;
  left.m10 = (float)auVar10._40_4_;
  left.m14 = (float)auVar10._44_4_;
  left.m3 = (float)auVar10._48_4_;
  left.m7 = (float)auVar10._52_4_;
  right.m8 = (float)in_stack_ffffffffffffff98;
  right.m12 = SUB84(in_stack_ffffffffffffff98,4);
  right.m0 = (float)in_stack_ffffffffffffff90;
  right.m4 = SUB84(in_stack_ffffffffffffff90,4);
  right.m1 = (float)in_stack_ffffffffffffffa0;
  right.m5 = SUB84(in_stack_ffffffffffffffa0,4);
  right._24_8_ = in_stack_ffffffffffffffa8;
  right.m2 = (float)in_stack_ffffffffffffffb0;
  right.m6 = SUB84(in_stack_ffffffffffffffb0,4);
  right.m10 = (float)in_stack_ffffffffffffffb8;
  right.m14 = SUB84(in_stack_ffffffffffffffb8,4);
  right.m3 = (float)in_stack_ffffffffffffffc0;
  right.m7 = SUB84(in_stack_ffffffffffffffc0,4);
  right.m11 = (float)in_stack_ffffffffffffffc8;
  right.m15 = SUB84(in_stack_ffffffffffffffc8,4);
  rf_mat_mul(left,right);
  lVar13 = position._0_8_ << 0x20;
  right_00.m14 = position.z;
  right_00.m10 = 1.0;
  left_00._8_8_ = uStack_e8;
  left_00._0_8_ = local_f0;
  left_00._16_8_ = local_e0;
  left_00._24_8_ = uStack_d8;
  left_00._32_8_ = local_d0;
  left_00._40_8_ = uStack_c8;
  left_00.m3 = (float)(int)in_stack_ffffffffffffff40;
  left_00.m7 = (float)(int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  left_00.m11 = (float)(int)in_stack_ffffffffffffff48;
  left_00.m15 = (float)(int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  right_00.m8 = (float)(int)lVar13;
  right_00.m12 = (float)(int)((ulong)lVar13 >> 0x20);
  right_00.m0 = 1.0;
  right_00.m4 = 0.0;
  right_00.m1 = 0.0;
  right_00.m5 = 1.0;
  right_00.m9 = (float)(int)((ulong)(uint)local_1d8._4_4_ << 0x20);
  right_00.m13 = (float)(int)(((ulong)(uint)local_1d8._4_4_ << 0x20) >> 0x20);
  right_00.m2 = 0.0;
  right_00.m6 = 0.0;
  right_00.m3 = 0.0;
  right_00.m7 = 0.0;
  right_00.m11 = 0.0;
  right_00.m15 = 1.0;
  rf_mat_mul(left_00,right_00);
  right_01.m8 = (float)(int)in_stack_ffffffffffffff58;
  right_01.m12 = (float)(int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  right_01.m0 = (float)(int)in_stack_ffffffffffffff50;
  right_01.m4 = (float)(int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  right_01.m1 = (float)(int)in_stack_ffffffffffffff60;
  right_01.m5 = (float)(int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  right_01.m9 = (float)(int)in_stack_ffffffffffffff68;
  right_01.m13 = (float)(int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  right_01.m2 = (float)(int)in_stack_ffffffffffffff70;
  right_01.m6 = (float)(int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  right_01.m10 = (float)(int)in_stack_ffffffffffffff78;
  right_01.m14 = (float)(int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  right_01.m3 = (float)(int)in_stack_ffffffffffffff80;
  right_01.m7 = (float)(int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  right_01.m11 = (float)(int)in_stack_ffffffffffffff88;
  right_01.m15 = (float)(int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  rf_mat_mul(model.transform,right_01);
  if (0 < model.mesh_count) {
    auVar8[0xc] = tint.a;
    auVar8._0_12_ = ZEXT712(0);
    auVar27._0_8_ = (double)(int)CONCAT32(auVar8._10_3_,(ushort)tint.b);
    auVar27._8_8_ = (double)(uint3)(auVar8._10_3_ >> 0x10);
    auVar19._0_8_ = (double)((uint)tint & 0xff);
    auVar19._8_8_ = (double)((uint)tint >> 8 & 0xff);
    auVar19 = divpd(auVar19,_DAT_00177f80);
    auVar27 = divpd(auVar27,_DAT_00177f80);
    lVar13 = 0;
    prVar12 = model.meshes;
    do {
      rVar1 = (model.materials[model.mesh_material[lVar13]].maps)->color;
      auVar9[0xc] = rVar1.a;
      auVar9._0_12_ = ZEXT712(0);
      auVar28._0_8_ = (double)((uint)rVar1 & 0xff);
      auVar28._8_8_ = (double)((uint)rVar1 >> 8 & 0xff);
      auVar20._0_8_ = (double)(int)CONCAT32(auVar9._10_3_,(ushort)rVar1.b);
      auVar20._8_8_ = (double)rVar1.a;
      auVar20 = divpd(auVar20,_DAT_00177f80);
      local_1c8 = auVar27._0_8_;
      dStack_1c0 = auVar27._8_8_;
      auVar28 = divpd(auVar28,_DAT_00177f80);
      local_1d8 = auVar19._0_8_;
      dStack_1d0 = auVar19._8_8_;
      iVar23 = (int)(auVar28._0_8_ * local_1d8 * (double)DAT_00177f80);
      iVar29 = (int)(auVar28._8_8_ * dStack_1d0 * DAT_00177f80._8_8_);
      iVar18 = (int)(auVar20._0_8_ * local_1c8 * (double)DAT_00177f80);
      iVar21 = (int)(auVar20._8_8_ * dStack_1c0 * DAT_00177f80._8_8_);
      sVar6 = (short)iVar23;
      cVar2 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar23 - (0xff < sVar6);
      sVar6 = (short)((uint)iVar23 >> 0x10);
      sVar22 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * (char)((uint)iVar23 >> 0x10) -
                        (0xff < sVar6),cVar2);
      sVar6 = (short)iVar29;
      cVar3 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar29 - (0xff < sVar6);
      sVar6 = (short)((uint)iVar29 >> 0x10);
      uVar24 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * (char)((uint)iVar29 >> 0x10) -
                        (0xff < sVar6),CONCAT12(cVar3,sVar22));
      sVar6 = (short)iVar18;
      cVar4 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar18 - (0xff < sVar6);
      sVar6 = (short)((uint)iVar18 >> 0x10);
      uVar26 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * (char)((uint)iVar18 >> 0x10) -
                        (0xff < sVar6),CONCAT14(cVar4,uVar24));
      sVar6 = (short)iVar21;
      cVar5 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar21 - (0xff < sVar6);
      sVar7 = (short)((uint)iVar21 >> 0x10);
      sVar6 = (short)((uint)uVar24 >> 0x10);
      rVar25.g = (0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6);
      rVar25.r = (0 < sVar22) * (sVar22 < 0x100) * cVar2 - (0xff < sVar22);
      sVar6 = (short)((uint6)uVar26 >> 0x20);
      rVar25.b = (0 < sVar6) * (sVar6 < 0x100) * cVar4 - (0xff < sVar6);
      sVar6 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * (char)((uint)iVar21 >> 0x10) -
                               (0xff < sVar7),CONCAT16(cVar5,uVar26)) >> 0x30);
      rVar25.a = (0 < sVar6) * (sVar6 < 0x100) * cVar5 - (0xff < sVar6);
      (model.materials[model.mesh_material[lVar13]].maps)->color = rVar25;
      iVar18 = model.mesh_material[lVar13];
      prVar14 = prVar12;
      puVar16 = (undefined8 *)&stack0xfffffffffffffcd8;
      for (lVar11 = 0xe; lVar11 != 0; lVar11 = lVar11 + -1) {
        *puVar16 = *(undefined8 *)prVar14;
        prVar14 = (rf_mesh *)((long)prVar14 + (ulong)bVar17 * -0x10 + 8);
        puVar16 = puVar16 + (ulong)bVar17 * -2 + 1;
      }
      prVar15 = model.materials + iVar18;
      puVar16 = (undefined8 *)&stack0xfffffffffffffd48;
      for (lVar11 = 0x13; lVar11 != 0; lVar11 = lVar11 + -1) {
        *puVar16 = *(undefined8 *)&prVar15->shader;
        prVar15 = (rf_material *)((long)prVar15 + (ulong)bVar17 * -0x10 + 8);
        puVar16 = puVar16 + (ulong)bVar17 * -2 + 1;
      }
      mesh.vertices = (float *)in_stack_ffffffffffffff48;
      mesh.vertex_count = (int)in_stack_ffffffffffffff40;
      mesh.triangle_count = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
      mesh.texcoords = (float *)in_stack_ffffffffffffff50;
      mesh.texcoords2 = (float *)in_stack_ffffffffffffff58;
      mesh.normals = (float *)in_stack_ffffffffffffff60;
      mesh.tangents = (float *)in_stack_ffffffffffffff68;
      mesh.colors = (uchar *)in_stack_ffffffffffffff70;
      mesh.indices = (unsigned_short *)in_stack_ffffffffffffff78;
      mesh.anim_vertices = (float *)in_stack_ffffffffffffff80;
      mesh.anim_normals = (float *)in_stack_ffffffffffffff88;
      mesh.bone_ids = (int *)in_stack_ffffffffffffff90;
      mesh.bone_weights = (float *)in_stack_ffffffffffffff98;
      mesh.vao_id = (uint)(float)in_stack_ffffffffffffffa0;
      mesh._100_4_ = SUB84(in_stack_ffffffffffffffa0,4);
      mesh.vbo_id = in_stack_ffffffffffffffa8;
      material.shader.locs[1] = (int)(float)in_stack_ffffffffffffffb8;
      material.shader.locs[2] = (int)SUB84(in_stack_ffffffffffffffb8,4);
      material.shader.id = (uint)(float)in_stack_ffffffffffffffb0;
      material.shader.locs[0] = (int)SUB84(in_stack_ffffffffffffffb0,4);
      material.shader.locs[3] = (int)(float)in_stack_ffffffffffffffc0;
      material.shader.locs[4] = (int)SUB84(in_stack_ffffffffffffffc0,4);
      material.shader.locs[5] = (int)(float)in_stack_ffffffffffffffc8;
      material.shader.locs[6] = (int)SUB84(in_stack_ffffffffffffffc8,4);
      material.shader.locs[7] = (int)unaff_RBX;
      material.shader.locs[8] = (int)((ulong)unaff_RBX >> 0x20);
      material.shader.locs[9] = (int)unaff_R12;
      material.shader.locs[10] = (int)((ulong)unaff_R12 >> 0x20);
      material.shader.locs[0xb] = (int)unaff_R13;
      material.shader.locs[0xc] = (int)((ulong)unaff_R13 >> 0x20);
      material.shader.locs[0xd] = (int)unaff_R14;
      material.shader.locs[0xe] = (int)((ulong)unaff_R14 >> 0x20);
      material.shader.locs[0xf] = (int)unaff_R15;
      material.shader.locs[0x10] = (int)((ulong)unaff_R15 >> 0x20);
      material.shader.locs[0x11] = (int)unaff_RBP;
      material.shader.locs[0x12] = (int)((ulong)unaff_RBP >> 0x20);
      material.shader.locs._84_8_ = local_130;
      material.shader.locs._76_8_ = unaff_retaddr;
      material.shader.locs._92_8_ = uStack_128;
      material.shader.locs._100_8_ = local_120;
      material.shader.locs._108_8_ = uStack_118;
      material.shader.locs._116_8_ = local_110;
      material._128_8_ = uStack_108;
      material.maps = (rf_material_map *)local_100;
      material.params = (float *)uStack_f8;
      rf_gfx_draw_mesh(mesh,material,model._64_64_);
      (model.materials[model.mesh_material[lVar13]].maps)->color = rVar1;
      lVar13 = lVar13 + 1;
      prVar12 = prVar12 + 1;
    } while (model.mesh_count != lVar13);
  }
  return;
}

Assistant:

RF_API void rf_draw_model_ex(rf_model model, rf_vec3 position, rf_vec3 rotation_axis, float rotationAngle, rf_vec3 scale, rf_color tint)
{
    // Calculate transformation matrix from function parameters
    // Get transform matrix (rotation -> scale -> translation)
    rf_mat mat_scale = rf_mat_scale(scale.x, scale.y, scale.z);
    rf_mat mat_rotation = rf_mat_rotate(rotation_axis, rotationAngle * RF_DEG2RAD);
    rf_mat mat_translation = rf_mat_translate(position.x, position.y, position.z);

    rf_mat mat_transform = rf_mat_mul(rf_mat_mul(mat_scale, mat_rotation), mat_translation);

    // Combine model transformation matrix (model.transform) with matrix generated by function parameters (mat_transform)
    model.transform = rf_mat_mul(model.transform, mat_transform);

    for (rf_int i = 0; i < model.mesh_count; i++)
    {
        // TODO: Review color + tint premultiplication mechanism
        rf_color color = model.materials[model.mesh_material[i]].maps[RF_MAP_DIFFUSE].color;

        rf_color color_tint = RF_WHITE;
        color_tint.r = (((float)color.r/255.0)*((float)tint.r/255.0))*255;
        color_tint.g = (((float)color.g/255.0)*((float)tint.g/255.0))*255;
        color_tint.b = (((float)color.b/255.0)*((float)tint.b/255.0))*255;
        color_tint.a = (((float)color.a/255.0)*((float)tint.a/255.0))*255;

        model.materials[model.mesh_material[i]].maps[RF_MAP_DIFFUSE].color = color_tint;
        rf_gfx_draw_mesh(model.meshes[i], model.materials[model.mesh_material[i]], model.transform);
        model.materials[model.mesh_material[i]].maps[RF_MAP_DIFFUSE].color = color;
    }
}